

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void run_ellswift_tests(void)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uchar *ell_b64;
  long lVar6;
  secp256k1_fe *x_in;
  long lVar7;
  secp256k1_context *psVar8;
  secp256k1_pubkey *bytes;
  long lVar9;
  secp256k1_context *r;
  secp256k1_context *r_00;
  ulong uVar10;
  ulong uVar11;
  secp256k1_context *b;
  uchar *puVar12;
  bool bVar13;
  uint64_t uStackY_bd0;
  uint64_t uStackY_bc8;
  uint64_t uStackY_bc0;
  secp256k1_ellswift_xdh_hash_function local_ba0;
  uchar share32_bad [32];
  uchar share32 [32];
  secp256k1_scalar sec;
  uchar sec32b_bad [32];
  uchar share32b [32];
  uchar share32a [32];
  uchar sec32 [32];
  uchar rnd32 [32];
  uint64_t local_a68;
  secp256k1_scalar sec_1;
  secp256k1_gej res;
  uchar ell64_1 [64];
  uchar auxrnd32 [32];
  secp256k1_pubkey pubkey2;
  secp256k1_scalar secb;
  secp256k1_scalar seca;
  uchar ell64 [64];
  secp256k1_fe x2;
  secp256k1_fe t;
  uint uStack_420;
  int local_3d0;
  
  psVar8 = (secp256k1_context *)ellswift_xswiftec_inv_tests[0].encs;
  lVar7 = 0;
  do {
    x_in = &ellswift_xswiftec_inv_tests[lVar7].x;
    lVar9 = 0;
    b = psVar8;
    do {
      r_00 = (secp256k1_context *)&t;
      r = (secp256k1_context *)x_in;
      uVar3 = secp256k1_ellswift_xswiftec_inv_var
                        ((secp256k1_fe *)r_00,x_in,&ellswift_xswiftec_inv_tests[lVar7].u,(uint)lVar9
                        );
      if (uVar3 != (((uint)ellswift_xswiftec_inv_tests[lVar7].enc_bitmap >> ((uint)lVar9 & 0x1f) & 1
                    ) != 0)) {
        run_ellswift_tests_cold_1();
LAB_001270b9:
        run_ellswift_tests_cold_3();
LAB_001270be:
        run_ellswift_tests_cold_2();
        goto LAB_001270c3;
      }
      if (uVar3 != 0) {
        r_00 = (secp256k1_context *)&t;
        r = b;
        iVar4 = fe_equal((secp256k1_fe *)r_00,(secp256k1_fe *)b);
        if (iVar4 == 0) goto LAB_001270b9;
        r = (secp256k1_context *)&x2;
        secp256k1_ellswift_xswiftec_var
                  ((secp256k1_fe *)r,&ellswift_xswiftec_inv_tests[lVar7].u,(secp256k1_fe *)b);
        r_00 = (secp256k1_context *)x_in;
        iVar4 = fe_equal(x_in,(secp256k1_fe *)r);
        if (iVar4 != 0) goto LAB_00126405;
        goto LAB_001270be;
      }
LAB_00126405:
      lVar9 = lVar9 + 1;
      b = (secp256k1_context *)&(b->ecmult_gen_ctx).ge_offset;
    } while (lVar9 != 8);
    lVar7 = lVar7 + 1;
    psVar8 = (secp256k1_context *)&psVar8[1].declassify;
  } while (lVar7 != 0x20);
  psVar8 = (secp256k1_context *)&ellswift_decode_tests[0].x;
  lVar7 = 0x4c;
  do {
    r = (secp256k1_context *)&x2;
    r_00 = CTX;
    iVar4 = secp256k1_ellswift_decode
                      (CTX,(secp256k1_pubkey *)&x2,
                       (uchar *)(psVar8[-1].ecmult_gen_ctx.proj_blind.n + 2));
    if (iVar4 == 0) goto LAB_001270c3;
    r = (secp256k1_context *)&t;
    r_00 = CTX;
    iVar4 = secp256k1_pubkey_load(CTX,(secp256k1_ge *)&t,(secp256k1_pubkey *)&x2);
    if (iVar4 == 0) goto LAB_001270c8;
    r = (secp256k1_context *)&t;
    r_00 = psVar8;
    iVar4 = fe_equal((secp256k1_fe *)psVar8,&t);
    if (iVar4 == 0) goto LAB_001270cd;
    if ((uStack_420 & 1) != (uint)(psVar8->ecmult_gen_ctx).ge_offset.x.n[0]) goto LAB_001270d2;
    psVar8 = (secp256k1_context *)((psVar8->ecmult_gen_ctx).ge_offset.y.n + 4);
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  lVar7 = 0x185574;
  lVar9 = 0;
  do {
    bVar13 = ellswift_xdh_tests_bip324[lVar9].initiating == 0;
    ell_b64 = ellswift_xdh_tests_bip324[lVar9].ellswift_theirs;
    puVar12 = ellswift_xdh_tests_bip324[lVar9].ellswift_ours;
    if (bVar13) {
      ell_b64 = ellswift_xdh_tests_bip324[lVar9].ellswift_ours;
      puVar12 = ellswift_xdh_tests_bip324[lVar9].ellswift_theirs;
    }
    r = (secp256k1_context *)&t;
    uStackY_bc0 = 0x12650a;
    r_00 = CTX;
    iVar4 = secp256k1_ellswift_xdh
                      (CTX,(uchar *)r,puVar12,ell_b64,ellswift_xdh_tests_bip324[lVar9].priv_ours,
                       (uint)bVar13,ellswift_xdh_hash_function_bip324,(void *)0x0);
    if (iVar4 == 0) goto LAB_001270d7;
    lVar6 = 0;
    do {
      bVar1 = *(byte *)((long)t.n + lVar6);
      r = (secp256k1_context *)(ulong)bVar1;
      bVar2 = *(byte *)(lVar7 + lVar6);
      r_00 = (secp256k1_context *)(ulong)bVar2;
      iVar4 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_0012653d;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    iVar4 = 0;
LAB_0012653d:
    if (iVar4 != 0) goto LAB_001270dc;
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + 0xc4;
  } while (lVar9 != 7);
  if (0 < COUNT) {
    iVar4 = 0;
    do {
      testutil_random_ge_test((secp256k1_ge *)&t);
      secp256k1_ge_to_storage((secp256k1_ge_storage *)&res,(secp256k1_ge *)&t);
      testrand256(rnd32);
      secp256k1_ellswift_encode(CTX,ell64,(secp256k1_pubkey *)&res,rnd32);
      secp256k1_ellswift_decode(CTX,&pubkey2,ell64);
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)&x2,&pubkey2);
      r = (secp256k1_context *)&x2;
      r_00 = (secp256k1_context *)&t;
      iVar5 = secp256k1_ge_eq_var((secp256k1_ge *)&t,(secp256k1_ge *)&x2);
      if (iVar5 == 0) goto LAB_001270e1;
      iVar4 = iVar4 + 1;
    } while (SBORROW4(iVar4,COUNT * 1000) != iVar4 + COUNT * -1000 < 0);
  }
  if (0 < COUNT) {
    uVar3 = 0;
    do {
      if ((uVar3 & 1) == 0) {
        puVar12 = (uchar *)0x0;
      }
      else {
        puVar12 = auxrnd32;
        testrand_bytes_test(puVar12,0x20);
      }
      testutil_random_scalar_order_test(&sec);
      secp256k1_scalar_get_b32(sec32,&sec);
      r = (secp256k1_context *)ell64_1;
      r_00 = CTX;
      iVar4 = secp256k1_ellswift_create(CTX,ell64_1,sec32,puVar12);
      if (iVar4 == 0) goto LAB_001270e6;
      secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)rnd32,ell64_1);
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)&pubkey2,(secp256k1_pubkey *)rnd32);
      share32._0_8_ = ell64;
      share32._8_8_ = &x2;
      r = (secp256k1_context *)&t;
      share32._16_8_ = r;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)share32,&res,1,(secp256k1_gej *)0x0,
                 &secp256k1_scalar_zero,&sec);
      secp256k1_gej_neg((secp256k1_gej *)r,&res);
      r_00 = r;
      secp256k1_gej_add_ge_var
                ((secp256k1_gej *)r,(secp256k1_gej *)r,(secp256k1_ge *)&pubkey2,(secp256k1_fe *)0x0)
      ;
      if (local_3d0 == 0) goto LAB_001270eb;
      uVar3 = uVar3 + 1;
    } while (SBORROW4(uVar3,COUNT * 400) != (int)(uVar3 + COUNT * -400) < 0);
  }
  if (0 < COUNT) {
    uVar3 = 0;
    do {
      testutil_random_scalar_order_test(&sec_1);
      secp256k1_scalar_get_b32((uchar *)&sec,&sec_1);
      testrand_bytes_test(ell64_1,0x20);
      testrand_bytes_test(ell64_1 + 0x20,0x20);
      secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)auxrnd32,ell64_1);
      secp256k1_pubkey_load(CTX,(secp256k1_ge *)rnd32,(secp256k1_pubkey *)auxrnd32);
      res.x.n[4] = local_a68;
      res.x.n[2]._0_1_ = rnd32[0x10];
      res.x.n[2]._1_1_ = rnd32[0x11];
      res.x.n[2]._2_1_ = rnd32[0x12];
      res.x.n[2]._3_1_ = rnd32[0x13];
      res.x.n[2]._4_1_ = rnd32[0x14];
      res.x.n[2]._5_1_ = rnd32[0x15];
      res.x.n[2]._6_1_ = rnd32[0x16];
      res.x.n[2]._7_1_ = rnd32[0x17];
      res.x.n[3]._0_1_ = rnd32[0x18];
      res.x.n[3]._1_1_ = rnd32[0x19];
      res.x.n[3]._2_1_ = rnd32[0x1a];
      res.x.n[3]._3_1_ = rnd32[0x1b];
      res.x.n[3]._4_1_ = rnd32[0x1c];
      res.x.n[3]._5_1_ = rnd32[0x1d];
      res.x.n[3]._6_1_ = rnd32[0x1e];
      res.x.n[3]._7_1_ = rnd32[0x1f];
      res.x.n[0]._0_1_ = rnd32[0];
      res.x.n[0]._1_1_ = rnd32[1];
      res.x.n[0]._2_1_ = rnd32[2];
      res.x.n[0]._3_1_ = rnd32[3];
      res.x.n[0]._4_1_ = rnd32[4];
      res.x.n[0]._5_1_ = rnd32[5];
      res.x.n[0]._6_1_ = rnd32[6];
      res.x.n[0]._7_1_ = rnd32[7];
      res.x.n[1]._0_1_ = rnd32[8];
      res.x.n[1]._1_1_ = rnd32[9];
      res.x.n[1]._2_1_ = rnd32[10];
      res.x.n[1]._3_1_ = rnd32[0xb];
      res.x.n[1]._4_1_ = rnd32[0xc];
      res.x.n[1]._5_1_ = rnd32[0xd];
      res.x.n[1]._6_1_ = rnd32[0xe];
      res.x.n[1]._7_1_ = rnd32[0xf];
      res.z.n[0] = 1;
      res.z.n[3] = 0;
      res.z.n[4] = 0;
      res.z.n[1] = 0;
      res.z.n[2] = 0;
      uStackY_bc0 = 0x126882;
      r = (secp256k1_context *)share32;
      r_00 = CTX;
      iVar4 = secp256k1_ellswift_xdh
                        (CTX,share32,ell64_1,ell64_1,(uchar *)&sec,uVar3 & 1,ellswift_xdh_hash_x32,
                         (void *)0x0);
      if (iVar4 == 0) goto LAB_001270f0;
      r = (secp256k1_context *)sec32;
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)r,share32);
      sec32b_bad._0_8_ = ell64;
      sec32b_bad._8_8_ = &x2;
      r_00 = (secp256k1_context *)&t;
      sec32b_bad._16_8_ = r_00;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)sec32b_bad,(secp256k1_gej *)&pubkey2,1,&res,&sec_1,
                 (secp256k1_scalar *)0x0);
      secp256k1_ge_set_gej((secp256k1_ge *)r_00,(secp256k1_gej *)&pubkey2);
      iVar4 = fe_equal((secp256k1_fe *)r_00,(secp256k1_fe *)r);
      if (iVar4 == 0) goto LAB_001270f5;
      uVar3 = uVar3 + 1;
    } while (SBORROW4(uVar3,COUNT * 800) != (int)(uVar3 + COUNT * -800) < 0);
  }
  if (0 < COUNT) {
    uVar10 = 0;
    do {
      iVar4 = (int)uVar10 + (int)(uVar10 / 3) * -3;
      if (iVar4 == 0) {
        local_ba0 = ellswift_xdh_hash_x32;
LAB_00126978:
        bytes = (secp256k1_pubkey *)0x0;
      }
      else {
        if (iVar4 == 1) {
          local_ba0 = ellswift_xdh_hash_function_bip324;
          goto LAB_00126978;
        }
        bytes = &pubkey2;
        testrand_bytes_test(bytes->data,0x20);
        testrand_bytes_test(pubkey2.data + 0x20,0x20);
        local_ba0 = ellswift_xdh_hash_function_prefix;
      }
      testrand_bytes_test(rnd32,0x20);
      testrand_bytes_test(ell64_1,0x20);
      testutil_random_scalar_order_test(&seca);
      testutil_random_scalar_order(&secb);
      secp256k1_scalar_get_b32((uchar *)&sec,&seca);
      secp256k1_scalar_get_b32(share32,&secb);
      r = (secp256k1_context *)&t;
      r_00 = CTX;
      iVar5 = secp256k1_ellswift_create(CTX,(uchar *)&t,(uchar *)&sec,rnd32);
      if (iVar5 == 0) goto LAB_001270fa;
      r = (secp256k1_context *)&x2;
      r_00 = CTX;
      iVar5 = secp256k1_ellswift_create(CTX,(uchar *)&x2,share32,ell64_1);
      if (iVar5 == 0) goto LAB_001270ff;
      r = (secp256k1_context *)share32a;
      uStackY_bc0 = 0x126a92;
      r_00 = CTX;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)r,(uchar *)&t,(uchar *)&x2,(uchar *)&sec,0,local_ba0,bytes);
      if (iVar5 == 0) goto LAB_00127104;
      r = (secp256k1_context *)share32b;
      uStackY_bc0 = 0x126ac4;
      r_00 = CTX;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)r,(uchar *)&t,(uchar *)&x2,share32,1,local_ba0,bytes);
      if (iVar5 == 0) goto LAB_00127109;
      lVar7 = 0;
      do {
        bVar1 = share32a[lVar7];
        r = (secp256k1_context *)(ulong)bVar1;
        bVar2 = share32b[lVar7];
        r_00 = (secp256k1_context *)(ulong)bVar2;
        iVar5 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00126b03;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      iVar5 = 0;
LAB_00126b03:
      if (iVar5 != 0) goto LAB_0012710e;
      res.x.n[4] = x2.n[4];
      res.x.n[2] = x2.n[2];
      res.x.n[3] = x2.n[3];
      res.x.n[0] = x2.n[0];
      res.x.n[1] = x2.n[1];
      testrand_flip((uchar *)&res,0x40);
      r = (secp256k1_context *)share32_bad;
      uStackY_bc0 = 0x126b7a;
      r_00 = CTX;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,(uchar *)r,(uchar *)&t,(uchar *)&res,(uchar *)&sec,0,local_ba0,bytes);
      if (iVar5 == 0) goto LAB_00127113;
      lVar7 = 0;
      do {
        bVar1 = share32_bad[lVar7];
        r = (secp256k1_context *)(ulong)bVar1;
        bVar2 = share32a[lVar7];
        r_00 = (secp256k1_context *)(ulong)bVar2;
        iVar5 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00126bae;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      iVar5 = 0;
LAB_00126bae:
      if (iVar5 == 0) goto LAB_00127118;
      ell64[0x20] = (undefined1)t.n[4];
      ell64[0x21] = t.n[4]._1_1_;
      ell64[0x22] = t.n[4]._2_1_;
      ell64[0x23] = t.n[4]._3_1_;
      ell64[0x24] = t.n[4]._4_1_;
      ell64[0x25] = t.n[4]._5_1_;
      ell64[0x26] = t.n[4]._6_1_;
      ell64[0x27] = t.n[4]._7_1_;
      ell64[0x10] = (undefined1)t.n[2];
      ell64[0x11] = t.n[2]._1_1_;
      ell64[0x12] = t.n[2]._2_1_;
      ell64[0x13] = t.n[2]._3_1_;
      ell64[0x14] = t.n[2]._4_1_;
      ell64[0x15] = t.n[2]._5_1_;
      ell64[0x16] = t.n[2]._6_1_;
      ell64[0x17] = t.n[2]._7_1_;
      ell64[0x18] = (undefined1)t.n[3];
      ell64[0x19] = t.n[3]._1_1_;
      ell64[0x1a] = t.n[3]._2_1_;
      ell64[0x1b] = t.n[3]._3_1_;
      ell64[0x1c] = t.n[3]._4_1_;
      ell64[0x1d] = t.n[3]._5_1_;
      ell64[0x1e] = t.n[3]._6_1_;
      ell64[0x1f] = t.n[3]._7_1_;
      ell64[0] = (undefined1)t.n[0];
      ell64[1] = t.n[0]._1_1_;
      ell64[2] = t.n[0]._2_1_;
      ell64[3] = t.n[0]._3_1_;
      ell64[4] = t.n[0]._4_1_;
      ell64[5] = t.n[0]._5_1_;
      ell64[6] = t.n[0]._6_1_;
      ell64[7] = t.n[0]._7_1_;
      ell64[8] = (undefined1)t.n[1];
      ell64[9] = t.n[1]._1_1_;
      ell64[10] = t.n[1]._2_1_;
      ell64[0xb] = t.n[1]._3_1_;
      ell64[0xc] = t.n[1]._4_1_;
      ell64[0xd] = t.n[1]._5_1_;
      ell64[0xe] = t.n[1]._6_1_;
      ell64[0xf] = t.n[1]._7_1_;
      testrand_flip(ell64,0x40);
      r = (secp256k1_context *)share32_bad;
      uStackY_bc0 = 0x126c2e;
      r_00 = CTX;
      iVar5 = secp256k1_ellswift_xdh(CTX,(uchar *)r,ell64,(uchar *)&x2,share32,1,local_ba0,bytes);
      if (iVar5 == 0) goto LAB_0012711d;
      lVar7 = 0;
      do {
        bVar1 = share32_bad[lVar7];
        r = (secp256k1_context *)(ulong)bVar1;
        bVar2 = share32b[lVar7];
        r_00 = (secp256k1_context *)(ulong)bVar2;
        iVar5 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_00126c62;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      iVar5 = 0;
LAB_00126c62:
      if (iVar5 == 0) goto LAB_00127122;
      sec_1.d[2] = sec.d[2];
      sec_1.d[3] = sec.d[3];
      sec_1.d[0] = sec.d[0];
      sec_1.d[1] = sec.d[1];
      testrand_flip((uchar *)&sec_1,0x20);
      uStackY_bc0 = 0x126cb9;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,share32_bad,(uchar *)&t,(uchar *)&x2,(uchar *)&sec_1,0,local_ba0,bytes)
      ;
      if (iVar5 != 0) {
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          r = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32a[lVar7];
          r_00 = (secp256k1_context *)(ulong)bVar2;
          iVar5 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00126ce9;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar5 = 0;
LAB_00126ce9:
        if (iVar5 == 0) goto LAB_00127127;
      }
      sec32b_bad[0x10] = share32[0x10];
      sec32b_bad[0x11] = share32[0x11];
      sec32b_bad[0x12] = share32[0x12];
      sec32b_bad[0x13] = share32[0x13];
      sec32b_bad[0x14] = share32[0x14];
      sec32b_bad[0x15] = share32[0x15];
      sec32b_bad[0x16] = share32[0x16];
      sec32b_bad[0x17] = share32[0x17];
      sec32b_bad[0x18] = share32[0x18];
      sec32b_bad[0x19] = share32[0x19];
      sec32b_bad[0x1a] = share32[0x1a];
      sec32b_bad[0x1b] = share32[0x1b];
      sec32b_bad[0x1c] = share32[0x1c];
      sec32b_bad[0x1d] = share32[0x1d];
      sec32b_bad[0x1e] = share32[0x1e];
      sec32b_bad[0x1f] = share32[0x1f];
      sec32b_bad[0] = share32[0];
      sec32b_bad[1] = share32[1];
      sec32b_bad[2] = share32[2];
      sec32b_bad[3] = share32[3];
      sec32b_bad[4] = share32[4];
      sec32b_bad[5] = share32[5];
      sec32b_bad[6] = share32[6];
      sec32b_bad[7] = share32[7];
      sec32b_bad[8] = share32[8];
      sec32b_bad[9] = share32[9];
      sec32b_bad[10] = share32[10];
      sec32b_bad[0xb] = share32[0xb];
      sec32b_bad[0xc] = share32[0xc];
      sec32b_bad[0xd] = share32[0xd];
      sec32b_bad[0xe] = share32[0xe];
      sec32b_bad[0xf] = share32[0xf];
      testrand_flip(sec32b_bad,0x20);
      uStackY_bc0 = 0x126d43;
      iVar5 = secp256k1_ellswift_xdh
                        (CTX,share32_bad,(uchar *)&t,(uchar *)&x2,sec32b_bad,1,local_ba0,bytes);
      if (iVar5 != 0) {
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          r = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32b[lVar7];
          r_00 = (secp256k1_context *)(ulong)bVar2;
          iVar5 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00126d73;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar5 = 0;
LAB_00126d73:
        if (iVar5 == 0) goto LAB_0012712c;
      }
      if (iVar4 != 0) {
        sec32[0x10] = ell64_1[0x10];
        sec32[0x11] = ell64_1[0x11];
        sec32[0x12] = ell64_1[0x12];
        sec32[0x13] = ell64_1[0x13];
        sec32[0x14] = ell64_1[0x14];
        sec32[0x15] = ell64_1[0x15];
        sec32[0x16] = ell64_1[0x16];
        sec32[0x17] = ell64_1[0x17];
        sec32[0x18] = ell64_1[0x18];
        sec32[0x19] = ell64_1[0x19];
        sec32[0x1a] = ell64_1[0x1a];
        sec32[0x1b] = ell64_1[0x1b];
        sec32[0x1c] = ell64_1[0x1c];
        sec32[0x1d] = ell64_1[0x1d];
        sec32[0x1e] = ell64_1[0x1e];
        sec32[0x1f] = ell64_1[0x1f];
        sec32[0] = ell64_1[0];
        sec32[1] = ell64_1[1];
        sec32[2] = ell64_1[2];
        sec32[3] = ell64_1[3];
        sec32[4] = ell64_1[4];
        sec32[5] = ell64_1[5];
        sec32[6] = ell64_1[6];
        sec32[7] = ell64_1[7];
        sec32[8] = ell64_1[8];
        sec32[9] = ell64_1[9];
        sec32[10] = ell64_1[10];
        sec32[0xb] = ell64_1[0xb];
        sec32[0xc] = ell64_1[0xc];
        sec32[0xd] = ell64_1[0xd];
        sec32[0xe] = ell64_1[0xe];
        sec32[0xf] = ell64_1[0xf];
        testrand_flip(sec32,0x20);
        r = (secp256k1_context *)&res;
        r_00 = CTX;
        iVar4 = secp256k1_ellswift_create(CTX,(uchar *)&res,share32,sec32);
        if (iVar4 == 0) goto LAB_00127131;
        r = (secp256k1_context *)share32_bad;
        uStackY_bc0 = 0x126e04;
        r_00 = CTX;
        iVar4 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)r,(uchar *)&t,(uchar *)&res,(uchar *)&sec,0,local_ba0,bytes)
        ;
        if (iVar4 == 0) goto LAB_00127136;
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          r = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32a[lVar7];
          r_00 = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00126e45;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar4 = 0;
LAB_00126e45:
        if (iVar4 == 0) goto LAB_0012713b;
        auxrnd32[0x10] = rnd32[0x10];
        auxrnd32[0x11] = rnd32[0x11];
        auxrnd32[0x12] = rnd32[0x12];
        auxrnd32[0x13] = rnd32[0x13];
        auxrnd32[0x14] = rnd32[0x14];
        auxrnd32[0x15] = rnd32[0x15];
        auxrnd32[0x16] = rnd32[0x16];
        auxrnd32[0x17] = rnd32[0x17];
        auxrnd32[0x18] = rnd32[0x18];
        auxrnd32[0x19] = rnd32[0x19];
        auxrnd32[0x1a] = rnd32[0x1a];
        auxrnd32[0x1b] = rnd32[0x1b];
        auxrnd32[0x1c] = rnd32[0x1c];
        auxrnd32[0x1d] = rnd32[0x1d];
        auxrnd32[0x1e] = rnd32[0x1e];
        auxrnd32[0x1f] = rnd32[0x1f];
        auxrnd32[0] = rnd32[0];
        auxrnd32[1] = rnd32[1];
        auxrnd32[2] = rnd32[2];
        auxrnd32[3] = rnd32[3];
        auxrnd32[4] = rnd32[4];
        auxrnd32[5] = rnd32[5];
        auxrnd32[6] = rnd32[6];
        auxrnd32[7] = rnd32[7];
        auxrnd32[8] = rnd32[8];
        auxrnd32[9] = rnd32[9];
        auxrnd32[10] = rnd32[10];
        auxrnd32[0xb] = rnd32[0xb];
        auxrnd32[0xc] = rnd32[0xc];
        auxrnd32[0xd] = rnd32[0xd];
        auxrnd32[0xe] = rnd32[0xe];
        auxrnd32[0xf] = rnd32[0xf];
        testrand_flip(auxrnd32,0x20);
        r = (secp256k1_context *)ell64;
        r_00 = CTX;
        iVar4 = secp256k1_ellswift_create(CTX,ell64,(uchar *)&sec,auxrnd32);
        if (iVar4 == 0) goto LAB_00127140;
        r = (secp256k1_context *)share32_bad;
        uStackY_bc0 = 0x126ec9;
        r_00 = CTX;
        iVar4 = secp256k1_ellswift_xdh(CTX,(uchar *)r,ell64,(uchar *)&x2,share32,1,local_ba0,bytes);
        if (iVar4 == 0) goto LAB_00127145;
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          r = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32b[lVar7];
          r_00 = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00126efd;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar4 = 0;
LAB_00126efd:
        if (iVar4 == 0) goto LAB_0012714a;
        r = (secp256k1_context *)share32_bad;
        uStackY_bc0 = 0x126f2a;
        r_00 = CTX;
        iVar4 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)r,(uchar *)&t,(uchar *)&x2,(uchar *)&sec,1,local_ba0,bytes);
        if (iVar4 == 0) goto LAB_0012714f;
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          r = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32a[lVar7];
          r_00 = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00126f5e;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar4 = 0;
LAB_00126f5e:
        if (iVar4 == 0) goto LAB_00127154;
        r = (secp256k1_context *)share32_bad;
        uStackY_bc0 = 0x126f86;
        r_00 = CTX;
        iVar4 = secp256k1_ellswift_xdh
                          (CTX,(uchar *)r,(uchar *)&t,(uchar *)&x2,share32,0,local_ba0,bytes);
        if (iVar4 == 0) goto LAB_00127159;
        lVar7 = 0;
        do {
          bVar1 = share32_bad[lVar7];
          r = (secp256k1_context *)(ulong)bVar1;
          bVar2 = share32b[lVar7];
          r_00 = (secp256k1_context *)(ulong)bVar2;
          iVar4 = (uint)bVar1 - (uint)bVar2;
          if (bVar1 != bVar2) goto LAB_00126fba;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        iVar4 = 0;
LAB_00126fba:
        if (iVar4 == 0) goto LAB_0012715e;
      }
      uVar3 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar3;
    } while (SBORROW4(uVar3,COUNT * 200) != (int)(uVar3 + COUNT * -200) < 0);
  }
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_encode",0x19);
  x2.n[0] = 0x28594b3d1a6524b;
  x2.n[1] = 0x1037a17796e42f4e;
  x2.n[2] = 0x560238851b8fcb8b;
  x2.n[3] = 0xd626b7152560ede1;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_create",0x19);
  x2.n[0] = 0xf7025f42d29e1bf5;
  x2.n[1] = 0x94cb7d59b024773;
  x2.n[2] = 0x3bc9786e59ed789;
  x2.n[3] = 0x4e363b5368335b35;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"bip324_ellswift_xonly_ecdh",0x1a);
  x2.n[0] = 0x827bd3928c12d730;
  x2.n[1] = 0x207b373e9e4fb2ee;
  x2.n[2] = 0xaa5441bc2292bd7a;
  x2.n[3] = 0xcfb5254915c3779f;
  test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
  return;
LAB_001270c3:
  run_ellswift_tests_cold_35();
LAB_001270c8:
  run_ellswift_tests_cold_34();
LAB_001270cd:
  run_ellswift_tests_cold_33();
LAB_001270d2:
  run_ellswift_tests_cold_4();
LAB_001270d7:
  run_ellswift_tests_cold_32();
LAB_001270dc:
  run_ellswift_tests_cold_5();
LAB_001270e1:
  run_ellswift_tests_cold_31();
LAB_001270e6:
  run_ellswift_tests_cold_30();
LAB_001270eb:
  run_ellswift_tests_cold_29();
LAB_001270f0:
  run_ellswift_tests_cold_28();
LAB_001270f5:
  run_ellswift_tests_cold_27();
LAB_001270fa:
  run_ellswift_tests_cold_26();
LAB_001270ff:
  run_ellswift_tests_cold_25();
LAB_00127104:
  run_ellswift_tests_cold_24();
LAB_00127109:
  run_ellswift_tests_cold_23();
LAB_0012710e:
  run_ellswift_tests_cold_6();
LAB_00127113:
  run_ellswift_tests_cold_22();
LAB_00127118:
  run_ellswift_tests_cold_21();
LAB_0012711d:
  run_ellswift_tests_cold_20();
LAB_00127122:
  run_ellswift_tests_cold_19();
LAB_00127127:
  run_ellswift_tests_cold_7();
LAB_0012712c:
  run_ellswift_tests_cold_8();
LAB_00127131:
  run_ellswift_tests_cold_18();
LAB_00127136:
  run_ellswift_tests_cold_17();
LAB_0012713b:
  run_ellswift_tests_cold_16();
LAB_00127140:
  run_ellswift_tests_cold_15();
LAB_00127145:
  run_ellswift_tests_cold_14();
LAB_0012714a:
  run_ellswift_tests_cold_13();
LAB_0012714f:
  run_ellswift_tests_cold_12();
LAB_00127154:
  run_ellswift_tests_cold_11();
LAB_00127159:
  run_ellswift_tests_cold_10();
LAB_0012715e:
  run_ellswift_tests_cold_9();
  uVar11 = ((r_00->ecmult_gen_ctx).scalar_offset.d[3] >> 0x30) * 0x1000003d1 +
           *(uint64_t *)&r_00->ecmult_gen_ctx;
  uVar10 = (uVar11 >> 0x34) + (r_00->ecmult_gen_ctx).scalar_offset.d[0];
  uStackY_bc8 = (0x3ffffffffffffc - (uVar10 & 0xfffffffffffff)) +
                (r->ecmult_gen_ctx).scalar_offset.d[0];
  uStackY_bc0 = (0x3ffffffffffffc -
                ((uVar10 >> 0x34) + (r_00->ecmult_gen_ctx).scalar_offset.d[1] & 0xfffffffffffff)) +
                (r->ecmult_gen_ctx).scalar_offset.d[1];
  uStackY_bd0 = (*(uint64_t *)&r->ecmult_gen_ctx - (uVar11 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
  secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)&uStackY_bd0);
  return;
}

Assistant:

void run_ellswift_tests(void) {
    int i = 0;
    /* Test vectors. */
    for (i = 0; (unsigned)i < sizeof(ellswift_xswiftec_inv_tests) / sizeof(ellswift_xswiftec_inv_tests[0]); ++i) {
        const struct ellswift_xswiftec_inv_test *testcase = &ellswift_xswiftec_inv_tests[i];
        int c;
        for (c = 0; c < 8; ++c) {
            secp256k1_fe t;
            int ret = secp256k1_ellswift_xswiftec_inv_var(&t, &testcase->x, &testcase->u, c);
            CHECK(ret == ((testcase->enc_bitmap >> c) & 1));
            if (ret) {
                secp256k1_fe x2;
                CHECK(fe_equal(&t, &testcase->encs[c]));
                secp256k1_ellswift_xswiftec_var(&x2, &testcase->u, &testcase->encs[c]);
                CHECK(fe_equal(&testcase->x, &x2));
            }
        }
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_decode_tests) / sizeof(ellswift_decode_tests[0]); ++i) {
        const struct ellswift_decode_test *testcase = &ellswift_decode_tests[i];
        secp256k1_pubkey pubkey;
        secp256k1_ge ge;
        int ret;
        ret = secp256k1_ellswift_decode(CTX, &pubkey, testcase->enc);
        CHECK(ret);
        ret = secp256k1_pubkey_load(CTX, &ge, &pubkey);
        CHECK(ret);
        CHECK(fe_equal(&testcase->x, &ge.x));
        CHECK(secp256k1_fe_is_odd(&ge.y) == testcase->odd_y);
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_xdh_tests_bip324) / sizeof(ellswift_xdh_tests_bip324[0]); ++i) {
        const struct ellswift_xdh_test *test = &ellswift_xdh_tests_bip324[i];
        unsigned char shared_secret[32];
        int ret;
        int party = !test->initiating;
        const unsigned char* ell_a64 = party ? test->ellswift_theirs : test->ellswift_ours;
        const unsigned char* ell_b64 = party ? test->ellswift_ours   : test->ellswift_theirs;
        ret = secp256k1_ellswift_xdh(CTX, shared_secret,
                                     ell_a64, ell_b64,
                                     test->priv_ours,
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(shared_secret, test->shared_secret, 32) == 0);
    }
    /* Verify that secp256k1_ellswift_encode + decode roundtrips. */
    for (i = 0; i < 1000 * COUNT; i++) {
        unsigned char rnd32[32];
        unsigned char ell64[64];
        secp256k1_ge g, g2;
        secp256k1_pubkey pubkey, pubkey2;
        /* Generate random public key and random randomizer. */
        testutil_random_ge_test(&g);
        secp256k1_pubkey_save(&pubkey, &g);
        testrand256(rnd32);
        /* Convert the public key to ElligatorSwift and back. */
        secp256k1_ellswift_encode(CTX, ell64, &pubkey, rnd32);
        secp256k1_ellswift_decode(CTX, &pubkey2, ell64);
        secp256k1_pubkey_load(CTX, &g2, &pubkey2);
        /* Compare with original. */
        CHECK(secp256k1_ge_eq_var(&g, &g2));
    }
    /* Verify the behavior of secp256k1_ellswift_create */
    for (i = 0; i < 400 * COUNT; i++) {
        unsigned char auxrnd32[32], sec32[32];
        secp256k1_scalar sec;
        secp256k1_gej res;
        secp256k1_ge dec;
        secp256k1_pubkey pub;
        unsigned char ell64[64];
        int ret;
        /* Generate random secret key and random randomizer. */
        if (i & 1) testrand256_test(auxrnd32);
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Construct ElligatorSwift-encoded public keys for that key. */
        ret = secp256k1_ellswift_create(CTX, ell64, sec32, (i & 1) ? auxrnd32 : NULL);
        CHECK(ret);
        /* Decode it, and compare with traditionally-computed public key. */
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_ecmult(&res, NULL, &secp256k1_scalar_zero, &sec);
        CHECK(secp256k1_gej_eq_ge_var(&res, &dec));
    }
    /* Verify that secp256k1_ellswift_xdh computes the right shared X coordinate. */
    for (i = 0; i < 800 * COUNT; i++) {
        unsigned char ell64[64], sec32[32], share32[32];
        secp256k1_scalar sec;
        secp256k1_ge dec, res;
        secp256k1_fe share_x;
        secp256k1_gej decj, resj;
        secp256k1_pubkey pub;
        int ret;
        /* Generate random secret key. */
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Generate random ElligatorSwift encoding for the remote key and decode it. */
        testrand256_test(ell64);
        testrand256_test(ell64 + 32);
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_gej_set_ge(&decj, &dec);
        /* Compute the X coordinate of seckey*pubkey using ellswift_xdh. Note that we
         * pass ell64 as claimed (but incorrect) encoding for sec32 here; this works
         * because the "hasher" function we use here ignores the ell64 arguments. */
        ret = secp256k1_ellswift_xdh(CTX, share32, ell64, ell64, sec32, i & 1, &ellswift_xdh_hash_x32, NULL);
        CHECK(ret);
        (void)secp256k1_fe_set_b32_limit(&share_x, share32); /* no overflow is possible */
        SECP256K1_FE_VERIFY(&share_x);
        /* Compute seckey*pubkey directly. */
        secp256k1_ecmult(&resj, &decj, &sec, NULL);
        secp256k1_ge_set_gej(&res, &resj);
        /* Compare. */
        CHECK(fe_equal(&res.x, &share_x));
    }
    /* Verify the joint behavior of secp256k1_ellswift_xdh */
    for (i = 0; i < 200 * COUNT; i++) {
        unsigned char auxrnd32a[32], auxrnd32b[32], auxrnd32a_bad[32], auxrnd32b_bad[32];
        unsigned char sec32a[32], sec32b[32], sec32a_bad[32], sec32b_bad[32];
        secp256k1_scalar seca, secb;
        unsigned char ell64a[64], ell64b[64], ell64a_bad[64], ell64b_bad[64];
        unsigned char share32a[32], share32b[32], share32_bad[32];
        unsigned char prefix64[64];
        secp256k1_ellswift_xdh_hash_function hash_function;
        void* data;
        int ret;

        /* Pick hasher to use. */
        if ((i % 3) == 0) {
            hash_function = ellswift_xdh_hash_x32;
            data = NULL;
        } else if ((i % 3) == 1) {
            hash_function = secp256k1_ellswift_xdh_hash_function_bip324;
            data = NULL;
        } else {
            hash_function = secp256k1_ellswift_xdh_hash_function_prefix;
            testrand256_test(prefix64);
            testrand256_test(prefix64 + 32);
            data = prefix64;
        }

        /* Generate random secret keys and random randomizers. */
        testrand256_test(auxrnd32a);
        testrand256_test(auxrnd32b);
        testutil_random_scalar_order_test(&seca);
        /* Draw secb uniformly at random to make sure that the secret keys
         * differ */
        testutil_random_scalar_order(&secb);
        secp256k1_scalar_get_b32(sec32a, &seca);
        secp256k1_scalar_get_b32(sec32b, &secb);

        /* Construct ElligatorSwift-encoded public keys for those keys. */
        /* For A: */
        ret = secp256k1_ellswift_create(CTX, ell64a, sec32a, auxrnd32a);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_create(CTX, ell64b, sec32b, auxrnd32b);
        CHECK(ret);

        /* Compute the shared secret both ways and compare with each other. */
        /* For A: */
        ret = secp256k1_ellswift_xdh(CTX, share32a, ell64a, ell64b, sec32a, 0, hash_function, data);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_xdh(CTX, share32b, ell64a, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        /* And compare: */
        CHECK(secp256k1_memcmp_var(share32a, share32b, 32) == 0);

        /* Verify that the shared secret doesn't match if other side's public key is incorrect. */
        /* For A (using a bad public key for B): */
        memcpy(ell64b_bad, ell64b, sizeof(ell64a_bad));
        testrand_flip(ell64b_bad, sizeof(ell64b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
        CHECK(ret); /* Mismatching encodings don't get detected by secp256k1_ellswift_xdh. */
        CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B (using a bad public key for A): */
        memcpy(ell64a_bad, ell64a, sizeof(ell64a_bad));
        testrand_flip(ell64a_bad, sizeof(ell64a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        /* Verify that the shared secret doesn't match if the private key is incorrect. */
        /* For A: */
        memcpy(sec32a_bad, sec32a, sizeof(sec32a_bad));
        testrand_flip(sec32a_bad, sizeof(sec32a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a_bad, 0, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B: */
        memcpy(sec32b_bad, sec32b, sizeof(sec32b_bad));
        testrand_flip(sec32b_bad, sizeof(sec32b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b_bad, 1, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        if (hash_function != ellswift_xdh_hash_x32) {
            /* Verify that the shared secret doesn't match when a different encoding of the same public key is used. */
            /* For A (changing B's public key): */
            memcpy(auxrnd32b_bad, auxrnd32b, sizeof(auxrnd32b_bad));
            testrand_flip(auxrnd32b_bad, sizeof(auxrnd32b_bad));
            ret = secp256k1_ellswift_create(CTX, ell64b_bad, sec32b, auxrnd32b_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (changing A's public key): */
            memcpy(auxrnd32a_bad, auxrnd32a, sizeof(auxrnd32a_bad));
            testrand_flip(auxrnd32a_bad, sizeof(auxrnd32a_bad));
            ret = secp256k1_ellswift_create(CTX, ell64a_bad, sec32a, auxrnd32a_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

            /* Verify that swapping sides changes the shared secret. */
            /* For A (claiming to be B): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (claiming to be A): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);
        }
    }

    /* Test hash initializers. */
    {
        secp256k1_sha256 sha, sha_optimized;
        static const unsigned char encode_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'e', 'n', 'c', 'o', 'd', 'e'};
        static const unsigned char create_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'c', 'r', 'e', 'a', 't', 'e'};
        static const unsigned char bip324_tag[] = {'b', 'i', 'p', '3', '2', '4', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'x', 'o', 'n', 'l', 'y', '_', 'e', 'c', 'd', 'h'};

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_encode has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, encode_tag, sizeof(encode_tag));
        secp256k1_ellswift_sha256_init_encode(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_create has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, create_tag, sizeof(create_tag));
        secp256k1_ellswift_sha256_init_create(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_bip324 has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, bip324_tag, sizeof(bip324_tag));
        secp256k1_ellswift_sha256_init_bip324(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);
    }
}